

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

int imagetopgx(opj_image_t *image,char *outfile)

{
  uint uVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  long lVar4;
  opj_image_comp_t *poVar5;
  size_t sVar6;
  char *pcVar7;
  FILE *__stream;
  char *pcVar8;
  size_t sVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  uchar byte;
  char bname [256];
  undefined1 local_189;
  ulong local_188;
  opj_image_comp_t *local_180;
  char *local_178;
  opj_image_t *local_170;
  long local_168;
  ulong local_160;
  ulong local_158;
  size_t local_150;
  ulong local_148;
  char *local_140;
  char local_138 [264];
  
  if (image->numcomps == 0) {
    return 0;
  }
  uVar17 = 0;
  local_170 = image;
  local_140 = outfile;
  do {
    pcVar8 = local_140;
    local_168 = uVar17 * 0x40;
    local_180 = image->comps + uVar17;
    sVar6 = strlen(local_140);
    if (pcVar8[sVar6 - 4] != '.') {
      imagetopgx_cold_1();
      return 1;
    }
    pcVar7 = local_138;
    local_148 = uVar17;
    if ((sVar6 - 0xff < 0xfffffffffffffeff) &&
       (pcVar7 = (char *)malloc(sVar6 + 3), pcVar7 == (char *)0x0)) {
      imagetopgx_cold_2();
      return 1;
    }
    local_188 = sVar6 - 0xff;
    memcpy(pcVar7,pcVar8,sVar6 - 4);
    sprintf(pcVar7 + (sVar6 - 4),"_%u.pgx",local_148);
    __stream = fopen(pcVar7,"wb");
    poVar5 = local_180;
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar7);
      if (0xfffffffffffffefe < local_188) {
        return 1;
      }
      free(pcVar7);
      return 1;
    }
    uVar1 = *(uint *)((long)&image->comps->w + local_168);
    uVar12 = (ulong)uVar1;
    bVar18 = local_180->sgnd != 0;
    uVar2 = *(uint *)((long)&image->comps->h + local_168);
    uVar17 = (ulong)uVar2;
    local_178 = pcVar7;
    fprintf(__stream,"PG ML %c %d %d %d\n",(ulong)(bVar18 + 0x2b + (uint)bVar18),
            (ulong)local_180->prec,uVar12,uVar17);
    iVar14 = (uint)(0x10 < poVar5->prec) * 2;
    if (poVar5->prec < 9) {
      local_150 = (size_t)(int)uVar1;
      pcVar8 = (char *)malloc(local_150);
      if (pcVar8 == (char *)0x0) {
        fwrite("Out of memory",0xd,1,_stderr);
        pcVar8 = local_178;
joined_r0x0010b2d4:
        if (local_188 < 0xfffffffffffffeff) {
LAB_0010b201:
          free(pcVar8);
        }
        fclose(__stream);
        return 1;
      }
      local_158 = uVar17;
      if (0 < (int)uVar2) {
        local_160 = uVar12 * 4;
        lVar11 = 0;
        uVar17 = 0;
        do {
          sVar6 = local_150;
          uVar2 = local_180->prec;
          if ((uVar2 == 8) && (local_180->sgnd == 0)) {
            if (0 < (int)uVar1) {
              lVar4 = *(long *)((long)&local_170->comps->data + local_168);
              uVar13 = 0;
              do {
                iVar14 = *(int *)(lVar4 + lVar11 + uVar13 * 4);
                if (0xfe < iVar14) {
                  iVar14 = 0xff;
                }
                cVar10 = (char)iVar14;
                if (iVar14 < 1) {
                  cVar10 = '\0';
                }
                pcVar8[uVar13] = cVar10;
                uVar13 = uVar13 + 1;
              } while (uVar12 != uVar13);
            }
          }
          else if (0 < (int)uVar1) {
            OVar3 = local_180->sgnd;
            lVar4 = *(long *)((long)&local_170->comps->data + local_168);
            uVar13 = 0;
            do {
              iVar14 = *(int *)(lVar4 + lVar11 + uVar13 * 4);
              if (OVar3 == 0) {
                if ((int)uVar2 < 9) {
                  if (0xfe < iVar14) {
                    iVar14 = 0xff;
                  }
                }
                else {
                  if (0x10 < uVar2) goto LAB_0010b005;
                  if (0xfffe < iVar14) {
                    iVar14 = 0xffff;
                  }
                }
                if (iVar14 < 1) {
                  iVar14 = 0;
                }
              }
              else if ((int)uVar2 < 9) {
                if (0x7e < iVar14) {
                  iVar14 = 0x7f;
                }
                if (iVar14 < -0x7f) {
                  iVar14 = -0x80;
                }
              }
              else if (uVar2 < 0x11) {
                if (0x7ffe < iVar14) {
                  iVar14 = 0x7fff;
                }
                if (iVar14 < -0x7fff) {
                  iVar14 = 0;
                }
              }
LAB_0010b005:
              pcVar8[uVar13] = (char)iVar14;
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          sVar9 = fwrite(pcVar8,1,local_150,__stream);
          pcVar7 = local_178;
          if (sVar9 != sVar6) {
            fprintf(_stderr,"failed to write %d bytes for %s\n",(ulong)uVar1,local_178);
            if (local_188 < 0xfffffffffffffeff) {
              free(pcVar7);
            }
            goto LAB_0010b201;
          }
          uVar17 = uVar17 + 1;
          lVar11 = lVar11 + local_160;
        } while (uVar17 != local_158);
      }
      free(pcVar8);
      image = local_170;
    }
    else if (0 < (int)(uVar1 * uVar2)) {
      local_160 = (ulong)(uVar1 * uVar2);
      local_158 = CONCAT44(local_158._4_4_,iVar14 + 2);
      local_150 = (size_t)(uint)((iVar14 + 1) * 8);
      uVar17 = 0;
      do {
        iVar14 = *(int *)(*(long *)((long)&image->comps->data + local_168) + uVar17 * 4);
        uVar1 = local_180->prec;
        if (local_180->sgnd == 0) {
          if ((int)uVar1 < 9) {
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
          }
          else {
            if (0x10 < uVar1) goto LAB_0010b138;
            if (0xfffe < iVar14) {
              iVar14 = 0xffff;
            }
          }
          if (iVar14 < 1) {
            iVar14 = 0;
          }
        }
        else if ((int)uVar1 < 9) {
          if (0x7e < iVar14) {
            iVar14 = 0x7f;
          }
          if (iVar14 < -0x7f) {
            iVar14 = -0x80;
          }
        }
        else if (uVar1 < 0x11) {
          if (0x7ffe < iVar14) {
            iVar14 = 0x7fff;
          }
          if (iVar14 < -0x7fff) {
            iVar14 = -0x8000;
          }
        }
LAB_0010b138:
        uVar12 = local_150 & 0xffffffff;
        iVar15 = (int)local_158;
        do {
          local_189 = (undefined1)(iVar14 >> ((byte)uVar12 & 0x1f));
          sVar6 = fwrite(&local_189,1,1,__stream);
          pcVar8 = local_178;
          if (sVar6 == 0) {
            fprintf(_stderr,"failed to write 1 byte for %s\n",local_178);
            goto joined_r0x0010b2d4;
          }
          uVar12 = (ulong)((int)uVar12 - 8);
          iVar16 = iVar15 + -1;
          bVar18 = 0 < iVar15;
          iVar15 = iVar16;
        } while (iVar16 != 0 && bVar18);
        uVar17 = uVar17 + 1;
        image = local_170;
      } while (uVar17 != local_160);
    }
    if (local_188 < 0xfffffffffffffeff) {
      free(local_178);
    }
    fclose(__stream);
    uVar17 = local_148 + 1;
    if (image->numcomps <= uVar17) {
      return 0;
    }
  } while( true );
}

Assistant:

int imagetopgx(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, j, fails = 1;
    unsigned int compno;
    FILE *fdest = NULL;

    for (compno = 0; compno < image->numcomps; compno++) {
        opj_image_comp_t *comp = &image->comps[compno];
        char bname[256]; /* buffer for name */
        char *name = bname; /* pointer */
        int nbytes = 0;
        size_t res;
        const size_t olen = strlen(outfile);
        const size_t dotpos = olen - 4;
        const size_t total = dotpos + 1 + 1 + 4; /* '-' + '[1-3]' + '.pgx' */

        if (outfile[dotpos] != '.') {
            /* `pgx` was recognized but there is no dot at expected position */
            fprintf(stderr, "ERROR -> Impossible happen.");
            goto fin;
        }
        if (total > 256) {
            name = (char*)malloc(total + 1);
            if (name == NULL) {
                fprintf(stderr, "imagetopgx: memory out\n");
                goto fin;
            }
        }
        memcpy(name, outfile, dotpos);
        sprintf(name + dotpos, "_%u.pgx", compno);
        fdest = fopen(name, "wb");
        /* don't need name anymore */

        if (!fdest) {

            fprintf(stderr, "ERROR -> failed to open %s for writing\n", name);
            if (total > 256) {
                free(name);
            }
            goto fin;
        }

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        fprintf(fdest, "PG ML %c %d %d %d\n", comp->sgnd ? '-' : '+', comp->prec,
                w, h);

        if (comp->prec <= 8) {
            nbytes = 1;
        } else if (comp->prec <= 16) {
            nbytes = 2;
        } else {
            nbytes = 4;
        }

        if (nbytes == 1) {
            unsigned char* line_buffer = malloc((size_t)w);
            if (line_buffer == NULL) {
                fprintf(stderr, "Out of memory");
                if (total > 256) {
                    free(name);
                }
                goto fin;
            }
            for (j = 0; j < h; j++) {
                if (comp->prec == 8 && comp->sgnd == 0) {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)CLAMP(image->comps[compno].data[j * w + i], 0,
                                                              255);
                    }
                } else {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)
                                         clamp(image->comps[compno].data[j * w + i],
                                               (int)comp->prec, (int)comp->sgnd);
                    }
                }
                res = fwrite(line_buffer, 1, (size_t)w, fdest);
                if (res != (size_t)w) {
                    fprintf(stderr, "failed to write %d bytes for %s\n", w, name);
                    if (total > 256) {
                        free(name);
                    }
                    free(line_buffer);
                    goto fin;
                }
            }
            free(line_buffer);
        } else {

            for (i = 0; i < w * h; i++) {
                /* FIXME: clamp func is being called within a loop */
                const int val = clamp(image->comps[compno].data[i],
                                      (int)comp->prec, (int)comp->sgnd);

                for (j = nbytes - 1; j >= 0; j--) {
                    int v = (int)(val >> (j * 8));
                    unsigned char byte = (unsigned char)v;
                    res = fwrite(&byte, 1, 1, fdest);

                    if (res < 1) {
                        fprintf(stderr, "failed to write 1 byte for %s\n", name);
                        if (total > 256) {
                            free(name);
                        }
                        goto fin;
                    }
                }
            }
        }

        if (total > 256) {
            free(name);
        }
        fclose(fdest);
        fdest = NULL;
    }
    fails = 0;
fin:
    if (fdest) {
        fclose(fdest);
    }

    return fails;
}